

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_psbt.cpp
# Opt level: O0

void __thiscall Psbt_SetOutputOnly_Test::~Psbt_SetOutputOnly_Test(Psbt_SetOutputOnly_Test *this)

{
  Psbt_SetOutputOnly_Test *this_local;
  
  ~Psbt_SetOutputOnly_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(Psbt, SetOutputOnly) {
  Psbt psbt("cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAAAA=");

  HDWallet wallet1 = HDWallet(ByteData(g_psbt_seed1));
  HDWallet wallet2 = HDWallet(ByteData(g_psbt_seed2));
  std::string path1 = "44h/0h/0h/0/2";
  std::string path2 = "44h/0h/0h/0/2";
  auto key1 = wallet1.GeneratePubkeyData(NetType::kTestnet, path1);
  auto key2 = wallet2.GeneratePubkeyData(NetType::kTestnet, path2);
  auto addr1 = Address(NetType::kTestnet, WitnessVersion::kVersion0, key1.GetPubkey());
  auto addr2 = Address(NetType::kTestnet, WitnessVersion::kVersion0, key2.GetPubkey());

  Amount amount(100000000);
  try {
    psbt.SetTxOutData(0, key1);
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
  }

  try {
    psbt.SetTxOutData(1, key2);
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
  }

  EXPECT_STREQ("70736274ff01004802000000000200e1f50500000000160014b322bddce633b851ac7370ab454f0b367a0654e500e1f50500000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a5550000000000220203473bfc8c770c1b220a2e7aae4badf6c0d7eaf29028d5b29d3438012bb289ef81182a7047602c00008000000080000000800000000002000000002202036474aff2633c351865539fb52b62b9d6fb9e4e23576628e1f0a0a7993458e06c189d6b6d862c0000800000008000000080000000000200000000", psbt.GetData().GetHex().c_str());
  auto b64 = CryptoUtil::EncodeBase64(psbt.GetData());
  Psbt psbt2(psbt.GetData());
  EXPECT_STREQ("cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAIgIDRzv8jHcMGyIKLnquS632wNfq8pAo1bKdNDgBK7KJ74EYKnBHYCwAAIAAAACAAAAAgAAAAAACAAAAACICA2R0r/JjPDUYZVOftStiudb7nk4jV2Yo4fCgp5k0WOBsGJ1rbYYsAACAAAAAgAAAAIAAAAAAAgAAAAA=", psbt.GetBase64().c_str());
  EXPECT_STREQ("cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAIgIDRzv8jHcMGyIKLnquS632wNfq8pAo1bKdNDgBK7KJ74EYKnBHYCwAAIAAAACAAAAAgAAAAAACAAAAACICA2R0r/JjPDUYZVOftStiudb7nk4jV2Yo4fCgp5k0WOBsGJ1rbYYsAACAAAAAgAAAAIAAAAAAAgAAAAA=", psbt2.GetBase64().c_str());
  EXPECT_STREQ("cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAIgIDRzv8jHcMGyIKLnquS632wNfq8pAo1bKdNDgBK7KJ74EYKnBHYCwAAIAAAACAAAAAgAAAAAACAAAAACICA2R0r/JjPDUYZVOftStiudb7nk4jV2Yo4fCgp5k0WOBsGJ1rbYYsAACAAAAAgAAAAIAAAAAAAgAAAAA=", b64.c_str());
}